

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O0

int it_669_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  int32 iVar2;
  void *pvVar3;
  DUMBFILE *in_RSI;
  long in_RDI;
  int32 truncated_size;
  int32 i;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((*(byte *)(in_RDI + 0x32) & 0x10) == 0) ||
     (*(int *)(in_RDI + 0x38) <= *(int *)(in_RDI + 0x40))) {
    iVar1 = 0;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x38) - *(int *)(in_RDI + 0x40);
    *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
  }
  pvVar3 = malloc((long)*(int *)(in_RDI + 0x38));
  *(void **)(in_RDI + 0x58) = pvVar3;
  if (*(long *)(in_RDI + 0x58) != 0) {
    if (*(int *)(in_RDI + 0x38) != 0) {
      iVar2 = dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (int32)((ulong)in_RDI >> 0x20),in_RSI);
      if (iVar2 < *(int *)(in_RDI + 0x38)) {
        if (iVar2 < 1) {
          *(undefined1 *)(in_RDI + 0x32) = 0;
          return 0;
        }
        *(int32 *)(in_RDI + 0x38) = iVar2;
        if (iVar2 < *(int *)(in_RDI + 0x40)) {
          *(int32 *)(in_RDI + 0x40) = iVar2;
        }
      }
      else {
        dumbfile_skip(in_RSI,CONCAT44(iVar2,iVar1));
        iVar1 = dumbfile_error(in_RSI);
        if (iVar1 != 0) {
          return -1;
        }
      }
      for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x38); iVar1 = iVar1 + 1) {
        *(byte *)(*(long *)(in_RDI + 0x58) + (long)iVar1) =
             *(byte *)(*(long *)(in_RDI + 0x58) + (long)iVar1) ^ 0x80;
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

static int it_669_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc(sample->length);

	if (!sample->data)
		return -1;

	if (sample->length)
	{
		i = dumbfile_getnc(sample->data, sample->length, f);
		
		if (i < sample->length) {
			//return -1;
			// ficking truncated files
			if (i <= 0) {
				sample->flags = 0;
				return 0;
			}
			sample->length = i;
			if (sample->loop_end > i) sample->loop_end = i;
		} else {
			/* skip truncated data */
			dumbfile_skip(f, truncated_size);
			// Should we be truncating it?
			if (dumbfile_error(f))
				return -1;
		}

		for (i = 0; i < sample->length; i++)
			((signed char *)sample->data)[i] ^= 0x80;
	}

	return 0;
}